

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O3

void __thiscall ViewTest::indexToOffsetTest<false>(ViewTest *this)

{
  int *piVar1;
  undefined8 uVar2;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var3;
  ulong *puVar4;
  size_t sVar5;
  size_t sVar6;
  unsigned_long uVar7;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var8;
  logic_error *plVar9;
  unsigned_long uVar10;
  ulong uVar11;
  ulong uVar12;
  code *pcVar13;
  pointer piVar14;
  undefined *puVar15;
  long *plVar16;
  size_t offset_1;
  View<int,_false,_std::allocator<unsigned_long>_> v;
  size_t offset;
  size_t local_f0;
  CoordinateOrder local_e8;
  allocator_type local_e1;
  undefined1 local_e0 [16];
  size_t *local_d0;
  size_t local_b8;
  pointer local_b0;
  ulong *local_a0;
  int *local_98;
  undefined1 local_90 [16];
  size_t *local_80;
  size_t local_68;
  ViewTest *local_50;
  size_t local_48;
  ulong local_40;
  size_t local_38;
  
  _Var3._M_current = (unsigned_long *)operator_new(0x18);
  *_Var3._M_current = 3;
  _Var3._M_current[1] = 2;
  _Var3._M_current[2] = 4;
  local_e0._0_8_ = this->data_;
  local_90._0_4_ = 1;
  local_f0 = CONCAT44(local_f0._4_4_,1);
  local_98 = (int *)local_e0._0_8_;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_e0 + 8),_Var3,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var3._M_current + 3),(CoordinateOrder *)local_90,(CoordinateOrder *)&local_f0,
             (allocator_type *)&local_e8);
  local_50 = this;
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e0);
  if (local_b0 != (pointer)0x0) {
    piVar14 = (pointer)0x0;
    do {
      local_90._0_8_ = (pointer)0x0;
      andres::View<int,_false,_std::allocator<unsigned_long>_>::indexToOffset
                ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e0,(size_t)piVar14,
                 (size_t *)local_90);
      if (piVar14 != (pointer)local_90._0_8_) {
        plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar9,"test failed.");
        __cxa_throw(plVar9,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      piVar14 = (pointer)((long)piVar14 + 1);
    } while (piVar14 < local_b0);
  }
  operator_delete(local_d0,local_b8 * 0x18);
  operator_delete(_Var3._M_current,0x18);
  _Var3._M_current = (unsigned_long *)operator_new(0x18);
  *_Var3._M_current = 3;
  _Var3._M_current[1] = 2;
  _Var3._M_current[2] = 4;
  local_90._0_4_ = 1;
  local_f0 = local_f0 & 0xffffffff00000000;
  local_e0._0_8_ = local_98;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_e0 + 8),_Var3,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var3._M_current + 3),(CoordinateOrder *)local_90,(CoordinateOrder *)&local_f0,
             (allocator_type *)&local_e8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e0);
  local_f0 = CONCAT44(local_f0._4_4_,1);
  local_e8 = LastMajorOrder;
  local_90._0_8_ = local_98;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_90 + 8),_Var3,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var3._M_current + 3),(CoordinateOrder *)&local_f0,&local_e8,&local_e1);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_90);
  puVar4 = (ulong *)operator_new(0x18);
  *puVar4 = 0;
  puVar4[1] = 0;
  puVar4[2] = 0;
  uVar10 = *_Var3._M_current;
  if (uVar10 != 0) {
    uVar7 = _Var3._M_current[1];
    uVar12 = 0;
    sVar5 = 0;
    uVar11 = uVar7;
    local_a0 = puVar4;
    do {
      puVar4[1] = 0;
      puVar4 = local_a0;
      if (uVar11 == 0) {
        uVar11 = 0;
      }
      else {
        uVar12 = _Var3._M_current[2];
        uVar11 = 0;
        do {
          puVar4[2] = 0;
          if (uVar12 == 0) {
            uVar12 = 0;
          }
          else {
            do {
              local_f0 = 0;
              andres::View<int,_false,_std::allocator<unsigned_long>_>::indexToOffset
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e0,sVar5,
                         &local_f0);
              local_38 = local_f0;
              local_40 = *local_a0;
              sVar6 = local_a0[1];
              uVar10 = local_a0[2];
              local_48 = sVar5;
              andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_90);
              uVar2 = local_90._0_8_;
              if (((int *)local_90._0_8_ == (int *)0x0) || (local_68 != 3)) {
                plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.");
                pcVar13 = std::runtime_error::~runtime_error;
                puVar15 = &std::runtime_error::typeinfo;
LAB_00152618:
                __cxa_throw(plVar9,puVar15,pcVar13);
              }
              sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                                ((View<int,_false,_std::allocator<unsigned_long>_> *)local_90,0);
              sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                      elementAccessHelper<unsigned_long>
                                ((View<int,_false,_std::allocator<unsigned_long>_> *)local_90,3,
                                 sVar6,uVar10);
              if (local_38 != (long)*(int *)(uVar2 + (sVar5 * local_40 + sVar6) * 4)) {
                plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(plVar9,"test failed.");
                pcVar13 = std::logic_error::~logic_error;
                puVar15 = &std::logic_error::typeinfo;
                goto LAB_00152618;
              }
              sVar5 = local_48 + 1;
              uVar11 = local_a0[2];
              local_a0[2] = uVar11 + 1;
              uVar12 = _Var3._M_current[2];
            } while (uVar11 + 1 < uVar12);
            uVar11 = local_a0[1];
            uVar7 = _Var3._M_current[1];
            puVar4 = local_a0;
          }
          uVar11 = uVar11 + 1;
          puVar4[1] = uVar11;
        } while (uVar11 < uVar7);
        uVar12 = *puVar4;
        uVar10 = *_Var3._M_current;
        uVar11 = uVar7;
      }
      uVar12 = uVar12 + 1;
      *puVar4 = uVar12;
    } while (uVar12 < uVar10);
  }
  operator_delete(puVar4,0x18);
  operator_delete(local_80,local_68 * 0x18);
  operator_delete(local_d0,local_b8 * 0x18);
  operator_delete(_Var3._M_current,0x18);
  _Var3._M_current = (unsigned_long *)operator_new(0x18);
  *_Var3._M_current = 3;
  _Var3._M_current[1] = 2;
  _Var3._M_current[2] = 4;
  local_90._0_8_ = local_90._0_8_ & 0xffffffff00000000;
  local_f0 = CONCAT44(local_f0._4_4_,1);
  local_e0._0_8_ = local_98;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_e0 + 8),_Var3,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var3._M_current + 3),(CoordinateOrder *)local_90,(CoordinateOrder *)&local_f0,
             (allocator_type *)&local_e8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e0);
  if (local_b0 != (pointer)0x0) {
    puVar4 = &DAT_00238670;
    piVar14 = (pointer)0x0;
    do {
      local_90._0_8_ = (pointer)0x0;
      andres::View<int,_false,_std::allocator<unsigned_long>_>::indexToOffset
                ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e0,(size_t)piVar14,
                 (size_t *)local_90);
      if ((pointer)local_90._0_8_ != (pointer)*puVar4) {
        plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar9,"test failed.");
        __cxa_throw(plVar9,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      piVar14 = (pointer)((long)piVar14 + 1);
      puVar4 = puVar4 + 1;
    } while (piVar14 < local_b0);
  }
  operator_delete(local_d0,local_b8 * 0x18);
  operator_delete(_Var3._M_current,0x18);
  _Var3._M_current = (unsigned_long *)operator_new(0x18);
  *_Var3._M_current = 3;
  _Var3._M_current[1] = 2;
  _Var3._M_current[2] = 4;
  local_90._0_8_ = local_90._0_8_ & 0xffffffff00000000;
  local_f0 = local_f0 & 0xffffffff00000000;
  local_e0._0_8_ = local_98;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_e0 + 8),_Var3,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var3._M_current + 3),(CoordinateOrder *)local_90,(CoordinateOrder *)&local_f0,
             (allocator_type *)&local_e8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e0);
  if (local_b0 != (pointer)0x0) {
    piVar14 = (pointer)0x0;
    do {
      local_90._0_8_ = (pointer)0x0;
      andres::View<int,_false,_std::allocator<unsigned_long>_>::indexToOffset
                ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e0,(size_t)piVar14,
                 (size_t *)local_90);
      if (piVar14 != (pointer)local_90._0_8_) {
        plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar9,"test failed.");
        __cxa_throw(plVar9,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      piVar14 = (pointer)((long)piVar14 + 1);
    } while (piVar14 < local_b0);
  }
  operator_delete(local_d0,local_b8 * 0x18);
  operator_delete(_Var3._M_current,0x18);
  _Var3._M_current = (unsigned_long *)operator_new(0x18);
  *_Var3._M_current = 3;
  _Var3._M_current[1] = 4;
  _Var3._M_current[2] = 2;
  _Var8._M_current = (unsigned_long *)operator_new(0x18);
  *_Var8._M_current = 2;
  _Var8._M_current[1] = 10;
  _Var8._M_current[2] = 0x23;
  piVar1 = local_50->data100_;
  local_90._0_4_ = 1;
  local_e0._0_8_ = piVar1 + 0x1e;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_e0 + 8),_Var3,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var3._M_current + 3),_Var8,(CoordinateOrder *)local_90,(allocator_type *)&local_f0)
  ;
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e0);
  if (local_b0 != (pointer)0x0) {
    plVar16 = &DAT_00238730;
    piVar14 = (pointer)0x0;
    do {
      local_90._0_8_ = (pointer)0x0;
      andres::View<int,_false,_std::allocator<unsigned_long>_>::indexToOffset
                ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e0,(size_t)piVar14,
                 (size_t *)local_90);
      if ((pointer)local_90._0_8_ != (pointer)(*plVar16 - 0x1eU)) {
        plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar9,"test failed.");
        __cxa_throw(plVar9,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      piVar14 = (pointer)((long)piVar14 + 1);
      plVar16 = plVar16 + 1;
    } while (piVar14 < local_b0);
  }
  operator_delete(local_d0,local_b8 * 0x18);
  operator_delete(_Var8._M_current,0x18);
  operator_delete(_Var3._M_current,0x18);
  _Var3._M_current = (unsigned_long *)operator_new(0x18);
  *_Var3._M_current = 3;
  _Var3._M_current[1] = 4;
  _Var3._M_current[2] = 2;
  _Var8._M_current = (unsigned_long *)operator_new(0x18);
  *_Var8._M_current = 2;
  _Var8._M_current[1] = 10;
  _Var8._M_current[2] = 0x23;
  local_90._0_8_ = local_90._0_8_ & 0xffffffff00000000;
  local_e0._0_8_ = piVar1 + 0x1e;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_e0 + 8),_Var3,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var3._M_current + 3),_Var8,(CoordinateOrder *)local_90,(allocator_type *)&local_f0)
  ;
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e0);
  if (local_b0 != (pointer)0x0) {
    plVar16 = &DAT_002387f0;
    piVar14 = (pointer)0x0;
    do {
      local_90._0_8_ = (pointer)0x0;
      andres::View<int,_false,_std::allocator<unsigned_long>_>::indexToOffset
                ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e0,(size_t)piVar14,
                 (size_t *)local_90);
      if ((pointer)local_90._0_8_ != (pointer)(*plVar16 - 0x1eU)) {
        plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar9,"test failed.");
        __cxa_throw(plVar9,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      piVar14 = (pointer)((long)piVar14 + 1);
      plVar16 = plVar16 + 1;
    } while (piVar14 < local_b0);
  }
  operator_delete(local_d0,local_b8 * 0x18);
  operator_delete(_Var8._M_current,0x18);
  operator_delete(_Var3._M_current,0x18);
  return;
}

Assistant:

void ViewTest::indexToOffsetTest() {
    // test cases: (externalFirstMajorOrder, internalFirstMajorOrder)
    // (false, false)
    {
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 2;
        shape[2] = 4;
        andres::View<int, constTarget> v(shape.begin(), shape.end(),
            data_, andres::LastMajorOrder, andres::LastMajorOrder);

        std::size_t trueOffset = 0;
        for(std::size_t index=0; index<v.size(); ++index) {
            std::size_t offset = 0;
            v.indexToOffset(index, offset);
            test(offset == trueOffset);
            ++trueOffset;
        }
    }
    // (false, true)
    {
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 2;
        shape[2] = 4;
        andres::View<int, constTarget> v(shape.begin(), shape.end(),
            data_, andres::LastMajorOrder, andres::FirstMajorOrder);
        andres::View<int> w(shape.begin(), shape.end(),
            data_, andres::LastMajorOrder, andres::LastMajorOrder);
    
        std::vector<std::size_t> c(3);
        std::size_t index = 0;
        for(c[0]=0; c[0]<shape[0]; ++c[0]) 
        for(c[1]=0; c[1]<shape[1]; ++c[1])
        for(c[2]=0; c[2]<shape[2]; ++c[2]) {
            std::size_t offset = 0;
            v.indexToOffset(index, offset);
            test(offset == static_cast<std::size_t>(w(c[0], c[1], c[2])));
            ++index;
        }
    
    }
    // (true, false)
    {
        std::size_t list[] = {0, 8, 16, 4, 12, 20, 1, 9, 17, 5, 13, 21, 
            2, 10, 18, 6, 14, 22, 3, 11, 19, 7, 15, 23}; 
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 2;
        shape[2] = 4;
        andres::View<int, constTarget> v(shape.begin(), shape.end(),
            data_, andres::FirstMajorOrder, andres::LastMajorOrder);

        for(std::size_t index=0; index<v.size(); ++index) {
            std::size_t offset = 0;
            v.indexToOffset(index, offset);
            test(offset == list[index]);
        }
    }
    
    // (true, true)
    {
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 2;
        shape[2] = 4;
        andres::View<int, constTarget> v(shape.begin(), shape.end(),
            data_, andres::FirstMajorOrder, andres::FirstMajorOrder);

        std::size_t trueOffset = 0;
        for(std::size_t index=0; index<v.size(); ++index) {
            std::size_t offset = 0;
            v.indexToOffset(index, offset);
            test(offset == trueOffset);
            ++trueOffset;
        }
    }

    // test also with non-trivial strides and non-zero offset
    // (false)
    {
        std::size_t list[] = {30, 32, 34, 40, 42, 44, 50, 52, 54, 60, 62, 64, 
            65, 67, 69, 75, 77, 79, 85, 87, 89, 95, 97, 99}; 
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 4;
        shape[2] = 2;
        std::vector<std::size_t> strides(3);
        strides[0] = 2;
        strides[1] = 10;
        strides[2] = 35;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), strides.begin(),
            data100_+30, andres::LastMajorOrder);
        
        for(std::size_t index=0; index<v.size(); ++index) {
            std::size_t offset = 0;
            v.indexToOffset(index, offset);
            test(offset == list[index]-30);
        }
    }
    // (true)
    {
        std::size_t list[] = {30, 65, 40, 75, 50, 85, 60, 95, 32, 67, 42, 77, 
            52, 87, 62, 97, 34, 69, 44, 79, 54, 89, 64, 99};
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 4;
        shape[2] = 2;
        std::vector<std::size_t> strides(3);
        strides[0] = 2;
        strides[1] = 10;
        strides[2] = 35;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), strides.begin(),
            data100_+30, andres::FirstMajorOrder);
        
        for(std::size_t index=0; index<v.size(); ++index) {
            std::size_t offset = 0;
            v.indexToOffset(index, offset);
            test(offset == list[index]-30);
        }
    }
}